

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetizer.cc
# Opt level: O2

ssize_t __thiscall decoder::Packetizer::read(Packetizer *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  int *in_R9;
  int iVar3;
  char local_44 [4];
  string local_40;
  
  iVar3 = (int)this->len_ - (int)this->pos_;
  peVar1 = (this->reader_).super___shared_ptr<decoder::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Reader[2])(peVar1,this->buf_ + this->pos_,(long)iVar3);
  if (iVar2 == -1) {
    perror("read");
    exit(1);
  }
  if (iVar2 != 0) {
    if (iVar2 != iVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_44[0] = '\"';
      local_44[1] = '\0';
      local_44[2] = '\0';
      local_44[3] = '\0';
      util::str<char[36],char[99],char[2],int>
                (&local_40,(util *)"Assertion `rv == nbytes` failed at ",
                 (char (*) [36])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/decoder/packetizer.cc"
                 ,(char (*) [99])0x16a222,(char (*) [2])local_44,in_R9);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->symbolPos_ = this->symbolPos_ + (long)iVar3;
  }
  return CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),iVar2 != 0);
}

Assistant:

bool Packetizer::read()  {
  int rv;
  int nbytes = len_ - pos_;
  rv = reader_->read(buf_ + pos_, nbytes);
  if (rv == -1) {
    perror("read");
    exit(1);
  }
  if (rv == 0) {
    return false;
  }
  ASSERT(rv == nbytes);
  symbolPos_ += nbytes;
  return true;
}